

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_EnumValueNameError_Test::
TestBody(ParserValidationErrorTest_EnumValueNameError_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38
  ;
  string_view local_20;
  ParserValidationErrorTest_EnumValueNameError_Test *local_10;
  ParserValidationErrorTest_EnumValueNameError_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"enum Foo {\n  BAR = 1;\n  BAR = 1;\n}\n");
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_38,"2:2: \"BAR\" is already defined.\n");
  ParserTest::ExpectHasValidationErrors(&this->super_ParserValidationErrorTest,local_20,&local_38);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_38);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, EnumValueNameError) {
  ExpectHasValidationErrors(
      "enum Foo {\n"
      "  BAR = 1;\n"
      "  BAR = 1;\n"
      "}\n",
      "2:2: \"BAR\" is already defined.\n");
}